

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void check_type_duplication
               (c2m_ctx_t c2m_ctx,type *type,node_t_conflict n,char *name,int size,int sign)

{
  pos_t pVar1;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  int sign_local;
  int size_local;
  char *name_local;
  node_t_conflict n_local;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  if ((type->mode == TM_BASIC) && ((type->u).basic_type == TP_UNDEF)) {
    if ((type->mode == TM_BASIC) || (size == 0)) {
      if ((type->mode != TM_BASIC) && (sign != 0)) {
        pVar1 = get_node_pos(c2m_ctx,n);
        local_60 = pVar1.fname;
        local_58 = pVar1._8_8_;
        error(c2m_ctx,0x1d6407,local_60,local_58);
      }
    }
    else {
      pVar1 = get_node_pos(c2m_ctx,n);
      local_50 = pVar1.fname;
      local_48 = pVar1._8_8_;
      error(c2m_ctx,0x1d63ec,local_50,local_48);
    }
  }
  else {
    pVar1 = get_node_pos(c2m_ctx,n);
    local_40 = pVar1.fname;
    local_38 = pVar1._8_8_;
    error(c2m_ctx,0x1d63d7,local_40,local_38,name);
  }
  return;
}

Assistant:

static void check_type_duplication (c2m_ctx_t c2m_ctx, struct type *type, node_t n,
                                    const char *name, int size, int sign) {
  if (type->mode != TM_BASIC || type->u.basic_type != TP_UNDEF)
    error (c2m_ctx, POS (n), "%s with another type", name);
  else if (type->mode != TM_BASIC && size != 0)
    error (c2m_ctx, POS (n), "size with non-numeric type");
  else if (type->mode != TM_BASIC && sign != 0)
    error (c2m_ctx, POS (n), "sign attribute with non-integer type");
}